

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O3

bool __thiscall ON_Brep::CloseTrimGap(ON_Brep *this,ON_BrepTrim *trim0,ON_BrepTrim *trim1)

{
  ulong uVar1;
  ISO IVar2;
  ISO IVar3;
  ON_BrepLoop *pOVar4;
  int *piVar5;
  double dVar6;
  ON_3dPoint from_pt;
  ON_3dPoint to_pt;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  double *pdVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  ON_3dPoint p;
  ON_3dPoint p1;
  ON_3dPoint p0;
  ON_Interval domain1;
  ON_Interval domain0;
  ON_3dPoint local_e8;
  double local_d0;
  ON_3dPoint local_c8;
  ON_3dPoint local_b0;
  double local_98;
  ON_Line local_90;
  ON_3dPoint local_60;
  ON_Interval local_48;
  ON_Interval local_38;
  
  if (trim0->m_vi[1] != trim1->m_vi[0]) {
    return false;
  }
  iVar7 = trim0->m_li;
  lVar11 = (long)iVar7;
  if (lVar11 < 0) {
    return false;
  }
  if (iVar7 != trim1->m_li) {
    return false;
  }
  if ((this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_count <=
      iVar7) {
    return false;
  }
  pOVar4 = (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a;
  uVar8 = pOVar4[lVar11].m_ti.m_count;
  uVar9 = (ulong)uVar8;
  if (uVar9 == 1) {
    if (trim0->m_trim_index != trim1->m_trim_index) {
LAB_0041684a:
      piVar5 = pOVar4[lVar11].m_ti.m_a;
      uVar12 = 0;
      do {
        uVar1 = uVar12 + 1;
        if (piVar5[uVar12] == trim0->m_trim_index) {
          uVar13 = 0;
          if (uVar9 - 1 != uVar12) {
            uVar13 = uVar1 & 0xffffffff;
          }
          if (piVar5[uVar13] == trim1->m_trim_index) goto LAB_00416889;
        }
        uVar12 = uVar1;
        if (uVar9 == uVar1) {
          return false;
        }
      } while( true );
    }
    iVar7 = (*(trim0->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
              _vptr_ON_Object[0x34])(trim0);
    if ((char)iVar7 != '\0') {
      return true;
    }
    uVar8 = pOVar4[lVar11].m_ti.m_count;
  }
  else if (0 < (int)uVar8) goto LAB_0041684a;
  uVar12 = 0;
LAB_00416889:
  if ((int)uVar8 <= (int)uVar12) {
    return false;
  }
  (*(trim0->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object._vptr_ON_Object
    [0x25])(trim0);
  (*(trim1->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object._vptr_ON_Object
    [0x25])(trim1);
  pdVar10 = ON_Interval::operator[](&local_38,1);
  local_98 = *pdVar10;
  pdVar10 = ON_Interval::operator[](&local_48,0);
  local_d0 = *pdVar10;
  ON_Curve::EvPoint((ON_Curve *)trim0,local_98,&local_b0,0,(int *)0x0);
  ON_Curve::EvPoint((ON_Curve *)trim1,local_d0,&local_c8,0,(int *)0x0);
  local_b0.z = 0.0;
  local_c8.z = 0.0;
  from_pt.y._0_4_ = SUB84(local_b0.y,0);
  from_pt.x = local_b0.x;
  from_pt.y._4_4_ = (int)((ulong)local_b0.y >> 0x20);
  from_pt.z = 0.0;
  to_pt.y = local_c8.y;
  to_pt.x = local_c8.x;
  to_pt.z = 0.0;
  ON_Line::ON_Line(&local_90,from_pt,to_pt);
  ON_Line::PointAt(&local_e8,&local_90,0.5);
  ON_Line::~ON_Line(&local_90);
  uVar14 = SUB84(local_b0.x,0);
  uVar15 = (undefined4)((ulong)local_b0.x >> 0x20);
  if ((local_b0.x == local_c8.x) && (!NAN(local_b0.x) && !NAN(local_c8.x))) {
    local_e8.x = local_b0.x;
  }
  if ((local_b0.y == local_c8.y) && (!NAN(local_b0.y) && !NAN(local_c8.y))) {
    local_e8.y = local_b0.y;
  }
  IVar2 = trim0->m_iso;
  iVar7 = -1;
  if (IVar2 - x_iso < 6) {
    iVar7 = *(int *)(&DAT_006a8990 + (ulong)(IVar2 - x_iso) * 4);
  }
  IVar3 = trim1->m_iso;
  if (IVar3 < iso_count) {
    if ((0x2aU >> (IVar3 & 0x1f) & 1) == 0) {
      if ((0x54U >> (IVar3 & 0x1f) & 1) != 0) {
        if (iVar7 == 1) {
          if (IVar2 != x_iso) {
            ON_Curve::PointAtStart(&local_90.from,(ON_Curve *)trim0);
            local_d0 = ON_3dPoint::DistanceTo(&local_b0,&local_90.from);
            ON_Curve::PointAtEnd(&local_60,(ON_Curve *)trim1);
            dVar6 = ON_3dPoint::DistanceTo(&local_c8,&local_60);
            if (dVar6 <= local_d0) {
              uVar14 = SUB84(local_b0.y,0);
              uVar15 = (undefined4)((ulong)local_b0.y >> 0x20);
            }
            else {
              uVar14 = SUB84(local_c8.y,0);
              uVar15 = (undefined4)((ulong)local_c8.y >> 0x20);
            }
            local_e8.y = (double)CONCAT44(uVar15,uVar14);
            goto LAB_00416b7f;
          }
        }
        else {
          if (iVar7 != 0) goto LAB_00416ad5;
          local_e8.x = local_b0.x;
        }
        local_e8.y = local_c8.y;
        goto LAB_00416b7f;
      }
      goto LAB_00416af8;
    }
    if (iVar7 == 1) {
      local_e8.x = local_c8.x;
      goto LAB_00416b03;
    }
    if ((iVar7 != 0) || (IVar3 != x_iso && IVar2 == x_iso)) {
LAB_00416ad5:
      local_e8.x = local_c8.x;
      goto LAB_00416b7f;
    }
    if (IVar2 == x_iso || IVar3 != x_iso) {
      ON_Curve::PointAtStart(&local_90.from,(ON_Curve *)trim0);
      local_d0 = ON_3dPoint::DistanceTo(&local_b0,&local_90.from);
      ON_Curve::PointAtEnd(&local_60,(ON_Curve *)trim1);
      dVar6 = ON_3dPoint::DistanceTo(&local_c8,&local_60);
      if (dVar6 <= local_d0) {
        uVar14 = SUB84(local_b0.x,0);
        uVar15 = (undefined4)((ulong)local_b0.x >> 0x20);
      }
      else {
        uVar14 = SUB84(local_c8.x,0);
        uVar15 = (undefined4)((ulong)local_c8.x >> 0x20);
      }
    }
  }
  else {
LAB_00416af8:
    if (iVar7 == 1) {
LAB_00416b03:
      local_e8.y = local_b0.y;
      goto LAB_00416b7f;
    }
    if (iVar7 != 0) goto LAB_00416b7f;
  }
  local_e8.x = (double)CONCAT44(uVar15,uVar14);
LAB_00416b7f:
  iVar7 = ON_ComparePoint(3,false,&local_e8.x,&local_b0.x);
  if (iVar7 != 0) {
    (*(trim0->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object._vptr_ON_Object
      [0x3a])(trim0);
  }
  iVar7 = ON_ComparePoint(3,false,&local_e8.x,&local_c8.x);
  if (iVar7 != 0) {
    (*(trim1->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object._vptr_ON_Object
      [0x39])(trim1);
  }
  return true;
}

Assistant:

bool ON_Brep::CloseTrimGap( ON_BrepTrim& trim0, ON_BrepTrim& trim1 )
{

  // carefully close gap between end of prev_trim and start of next_trim

  // make sure trim0 and trim1 are adjacent trims in a trimming loop
  if ( trim0.m_vi[1] != trim1.m_vi[0] )
    return false;
  if ( trim0.m_li != trim1.m_li )
    return false;
  if ( trim0.m_li < 0 || trim0.m_li >= m_L.Count() )
    return false;
  ON_BrepLoop& loop = m_L[trim0.m_li];
  int lti;
  if ( loop.m_ti.Count() == 1 && trim0.m_trim_index == trim1.m_trim_index )
  {
    if ( trim0.IsClosed() )
      return true;
    lti = 0;
  }
  else
  {
    for ( lti = 0; lti < loop.m_ti.Count(); lti++ )
    {
      if ( loop.m_ti[lti] == trim0.m_trim_index && loop.m_ti[(lti+1)%loop.m_ti.Count()] == trim1.m_trim_index )
        break;
    }
  }
  if ( lti >= loop.m_ti.Count() )
    return false;

  // determine where trims end and where they should meet.
  ON_Interval domain0 = trim0.Domain();
  ON_Interval domain1 = trim1.Domain();
  double t0 = domain0[1];
  double t1 = domain1[0];
  ON_3dPoint p0, p1;
  trim0.EvPoint( t0, p0 );
  trim1.EvPoint( t1, p1 );
  p0.z = 0.0;
  p1.z = 0.0;
  ON_3dPoint p = ON_Line(p0,p1).PointAt(0.5);
  if ( p0.x == p1.x )
    p.x = p0.x;
  if ( p0.y == p1.y )
    p.y = p0.y;

  int coord0_lock = -1;
  int coord1_lock = -1;
  switch(trim0.m_iso)
  {
  case ON_Surface::x_iso:
  case ON_Surface::W_iso:
  case ON_Surface::E_iso:
    // vertical iso curve - lock x coordinate
    coord0_lock = 0;
    break;
  case ON_Surface::y_iso:
  case ON_Surface::S_iso:
  case ON_Surface::N_iso:
    // horizontal iso curve - lock y coordinate
    coord0_lock = 1;
    break;
  default:
    coord0_lock = -1;
  }

  switch(trim1.m_iso)
  {
  case ON_Surface::x_iso:
  case ON_Surface::W_iso:
  case ON_Surface::E_iso:
    // vertical iso curve - lock x coordinate
    coord1_lock = 0;
    switch(coord0_lock)
    {
    case 0:
      if ( ON_Surface::x_iso == trim0.m_iso && ON_Surface::x_iso != trim1.m_iso )
        p.x = p1.x; // trim1 is on surface edge
      else if ( ON_Surface::x_iso != trim0.m_iso && ON_Surface::x_iso == trim1.m_iso )
        p.x = p0.x; // trim0 is on surface edge
      else
      {
        // longest one wins
        if ( p0.DistanceTo(trim0.PointAtStart()) >= p1.DistanceTo(trim1.PointAtEnd()) )
          p.x = p0.x;
        else
          p.x = p1.x;
      }
      break;
    case 1:
      p.x = p1.x;
      p.y = p0.y;
      break;
    default:
      p.x = p1.x;
      break;
    }
    break;
  case ON_Surface::y_iso:
  case ON_Surface::S_iso:
  case ON_Surface::N_iso:
    // horizontal iso curve - lock y coordinate
    coord1_lock = 1;
    switch(coord0_lock)
    {
    case 0:
      p.x = p0.x;
      p.y = p1.y;
      break;
    case 1:
      if ( ON_Surface::x_iso == trim0.m_iso && ON_Surface::x_iso != trim1.m_iso )
        p.y = p1.y; // trim1 is on surface edge
      else if ( ON_Surface::x_iso != trim0.m_iso && ON_Surface::x_iso == trim1.m_iso )
        p.y = p0.y; // trim0 is on surface edge
      else
      {
        // longest one wins
        if ( p0.DistanceTo(trim0.PointAtStart()) >= p1.DistanceTo(trim1.PointAtEnd()) )
          p.y = p0.y;
        else
          p.y = p1.y;
      }
      break;
    default:
      p.x = p1.x;
      break;
    }
    break;
  default:
    switch(coord0_lock)
    {
    case 0:
      p.x = p0.x;
      break;
    case 1:
      p.y = p0.y;
      break;
    }
    break;
  }

  if (ON_ComparePoint(3,0,&p.x,&p0.x))
  {
    trim0.SetEndPoint(p);
  }
  if (ON_ComparePoint(3,0,&p.x,&p1.x))
  {
    trim1.SetStartPoint(p);
  }

  return true;
}